

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security-bootstrapping.c
# Opt level: O2

void on_sign_on_data(uint8_t *raw_data,uint32_t data_size,void *userdata)

{
  uint8_t *block_value;
  ndn_name_t *name;
  uint32_t uVar1;
  int iVar2;
  ndn_ecc_prv_t *ecc_prv;
  ndn_aes_key_t *aes_key;
  uint32_t uVar3;
  undefined1 local_13d8 [8];
  ndn_data_t data;
  ndn_data_t trust_anchor_cert;
  ndn_name_t prefix_to_register;
  uint8_t dh_pub_buf [100];
  undefined1 local_88 [8];
  ndn_encoder_t encoder;
  uint8_t shared [32];
  uint8_t symmetric_key [16];
  uint8_t salt [16];
  uint local_2c;
  uint32_t local_24 [2];
  uint32_t probe;
  
  iVar2 = ndn_data_tlv_decode_hmac_verify
                    ((ndn_data_t *)local_13d8,raw_data,data_size,
                     m_sec_boot_state.pre_shared_hmac_key);
  if (iVar2 == 0) {
    printf("DEBUG: %s, L%d: ","on_sign_on_data",0x135);
    printf("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-PKT-SIZE: %u Bytes\n",data_size);
    printf("INFO: %s: ","on_sign_on_data");
    printf("[BOOTSTRAPPING] Receive Sign On Data packet with name");
    putchar(10);
    ndn_name_print((ndn_name_t *)local_13d8);
    local_24[0] = 0;
    block_value = &data.metainfo.final_block_id.size;
    salt._8_8_ = block_value;
    decoder_get_var((ndn_decoder_t *)(salt + 8),local_24);
    if (local_24[0] == 6) {
      decoder_get_var((ndn_decoder_t *)(salt + 8),local_24);
      uVar1 = local_24[0];
      local_2c = local_24[0];
      iVar2 = 1;
      if (0xfc < local_24[0]) {
        iVar2 = (0xffff < local_24[0]) + 3 + (uint)(0xffff < local_24[0]);
      }
      uVar3 = local_24[0] + iVar2 + 1;
      ndn_sha256((uint8_t *)salt._8_8_,uVar3,m_sec_boot_state.trust_anchor_sha);
      iVar2 = ndn_data_tlv_decode_no_verify
                        ((ndn_data_t *)(data.signature.validity_period.not_after + 9),block_value,
                         uVar3,(uint32_t *)0x0,(uint32_t *)0x0);
      if (iVar2 == 0) {
        ndn_key_storage_set_trust_anchor
                  ((ndn_data_t *)(data.signature.validity_period.not_after + 9));
        decoder_get_var((ndn_decoder_t *)(salt + 8),local_24);
        if (local_24[0] == 0xa3) {
          decoder_get_var((ndn_decoder_t *)(salt + 8),local_24);
          uVar3 = local_24[0];
          if ((int)local_24[0] <= (int)(data.content_value._1016_4_ - uVar1)) {
            memcpy(&prefix_to_register.components[9].size,(void *)((ulong)uVar1 + salt._8_8_),
                   (ulong)local_24[0]);
            local_2c = uVar1 + uVar3;
          }
          ndn_ecc_pub_init(&m_sec_boot_state.controller_dh_pub,
                           &prefix_to_register.components[9].size,uVar3,' ',1);
          ecc_prv = ndn_key_storage_get_ecc_prv_key(0x2712);
          m_measure_tp1 = ndn_time_now_us();
          ndn_ecc_dh_shared_secret
                    (&m_sec_boot_state.controller_dh_pub,ecc_prv,(uint8_t *)&encoder.output_max_size
                     ,0x20);
          m_measure_tp2 = ndn_time_now_us();
          printf("DEBUG: %s, L%d: ","on_sign_on_data",0x15f);
          printf("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-ECDH: %lu\n",m_measure_tp2 - m_measure_tp1);
          decoder_get_var((ndn_decoder_t *)(salt + 8),local_24);
          if (local_24[0] == 0x83) {
            decoder_get_var((ndn_decoder_t *)(salt + 8),local_24);
            if (0xf < (int)(data.content_value._1016_4_ - local_2c)) {
              symmetric_key._8_8_ = *(undefined8 *)(salt._8_8_ + (ulong)local_2c);
              salt._0_8_ = *(undefined8 *)((uint8_t *)(salt._8_8_ + (ulong)local_2c) + 8);
            }
            m_measure_tp1 = ndn_time_now_us();
            aes_key = ndn_key_storage_get_empty_aes_key();
            ndn_hkdf((uint8_t *)&encoder.output_max_size,0x20,shared + 0x18,0x10,symmetric_key + 8,
                     0x10,(uint8_t *)0x0,0);
            ndn_aes_load_key(aes_key,shared + 0x18,0x10);
            aes_key->key_id = 0x2713;
            m_measure_tp2 = ndn_time_now_us();
            printf("DEBUG: %s, L%d: ","on_sign_on_data",0x176);
            printf("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-HKDF: %lu\n",m_measure_tp2 - m_measure_tp1);
            name = (ndn_name_t *)(trust_anchor_cert.signature.validity_period.not_after + 0xd);
            ndn_name_init(name);
            ndn_name_append_component
                      (name,(name_component_t *)(data.signature.validity_period.not_after + 9));
            memset(sec_boot_buf,0,0x1000);
            local_88 = (undefined1  [8])sec_boot_buf;
            encoder.output_value = (uint8_t *)0x1000;
            ndn_name_tlv_encode((ndn_encoder_t *)local_88,name);
            ndn_forwarder_add_route
                      (m_sec_boot_state.face,(uint8_t *)local_88,(ulong)encoder.output_value >> 0x20
                      );
            ndn_time_delay(0x3c);
            sec_boot_send_cert_interest();
          }
        }
      }
    }
  }
  else {
    printf("ERROR: %s, L%d: ","on_sign_on_data",0x132);
    printf("[BOOTSTRAPPING] Decoding failed.");
  }
  return;
}

Assistant:

void
on_sign_on_data(const uint8_t* raw_data, uint32_t data_size, void* userdata)
{
  // parse received data
  ndn_data_t data;
  if (ndn_data_tlv_decode_hmac_verify(&data, raw_data, data_size, m_sec_boot_state.pre_shared_hmac_key) != NDN_SUCCESS) {
    NDN_LOG_ERROR("[BOOTSTRAPPING] Decoding failed.");
    return;
  }
  NDN_LOG_DEBUG("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-PKT-SIZE: %u Bytes\n", data_size);
  NDN_LOG_INFO("[BOOTSTRAPPING] Receive Sign On Data packet with name");
  NDN_LOG_INFO_NAME(&data.name);
  uint32_t probe = 0;

  // parse content
  // format: a data packet, ecdh pub, salt
  ndn_decoder_t decoder;
  decoder_init(&decoder, data.content_value, data.content_size);
  // trust anchor certificate
  decoder_get_type(&decoder, &probe);
  if (probe != TLV_Data) return;
  decoder_get_length(&decoder, &probe);
  decoder.offset += probe;
  // calculate the sha256 digest of the trust anchor
  ndn_sha256(decoder.input_value, encoder_probe_block_size(TLV_Data, probe),
             m_sec_boot_state.trust_anchor_sha);
  ndn_data_t trust_anchor_cert;
  if (ndn_data_tlv_decode_no_verify(&trust_anchor_cert, data.content_value, encoder_probe_block_size(TLV_Data, probe), NULL, NULL) != NDN_SUCCESS) {
    return;
  }
  // key storage set trust anchor
  ndn_key_storage_set_trust_anchor(&trust_anchor_cert);
  // parse ecdh pub key, N2
  decoder_get_type(&decoder, &probe);
  if (probe != TLV_SEC_BOOT_N2_ECDH_PUB) return;
  decoder_get_length(&decoder, &probe);
  uint8_t dh_pub_buf[100];
  decoder_get_raw_buffer_value(&decoder, dh_pub_buf, probe);
  ndn_ecc_pub_init(&m_sec_boot_state.controller_dh_pub, dh_pub_buf, probe, NDN_ECDSA_CURVE_SECP256R1, 1);
  ndn_ecc_prv_t* self_prv_key = ndn_key_storage_get_ecc_prv_key(SEC_BOOT_DH_KEY_ID);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  // get shared secret using DH process
  uint8_t shared[32];
  ndn_ecc_dh_shared_secret(&m_sec_boot_state.controller_dh_pub, self_prv_key, shared, sizeof(shared));

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-ECDH: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif

  // decode salt from the replied data
  decoder_get_type(&decoder, &probe);
  if (probe != TLV_AC_SALT) return;
  decoder_get_length(&decoder, &probe);
  uint8_t salt[NDN_APPSUPPORT_AC_SALT_SIZE];
  decoder_get_raw_buffer_value(&decoder, salt, sizeof(salt));

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  // generate AES key using HKDF
  ndn_aes_key_t* sym_aes_key = ndn_key_storage_get_empty_aes_key();
  uint8_t symmetric_key[NDN_APPSUPPORT_AC_EDK_SIZE];
  ndn_hkdf(shared, sizeof(shared), symmetric_key, sizeof(symmetric_key),
           salt, sizeof(salt), NULL, 0);
  ndn_aes_key_init(sym_aes_key, symmetric_key, sizeof(symmetric_key), SEC_BOOT_AES_KEY_ID);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-HKDF: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif

  // prepare for the next interest: register the prefix
  ndn_name_t prefix_to_register;
  ndn_name_init(&prefix_to_register);
  ndn_name_append_component(&prefix_to_register, &trust_anchor_cert.name.components[0]);
  ndn_encoder_t encoder;
  encoder_init(&encoder, sec_boot_buf, sizeof(sec_boot_buf));
  ndn_name_tlv_encode(&encoder, &prefix_to_register);
  ndn_forwarder_add_route(m_sec_boot_state.face, encoder.output_value, encoder.offset);
  // send cert interest
  ndn_time_delay(60);
  sec_boot_send_cert_interest();
}